

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

bool __thiscall spv::Builder::containsPhysicalStorageBufferOrArray(Builder *this,Id typeId)

{
  Op OVar1;
  Instruction *this_00;
  bool bVar2;
  int iVar3;
  Id typeId_00;
  StorageClass SVar4;
  int op;
  
  while( true ) {
    this_00 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start[typeId];
    OVar1 = this_00->opCode;
    if (OVar1 != OpTypeArray) break;
    typeId = getContainedTypeId(this,typeId,0);
  }
  if (OVar1 == OpTypePointer) {
    SVar4 = Module::getStorageClass(&this->module,typeId);
    bVar2 = SVar4 == PhysicalStorageBuffer;
  }
  else {
    if (OVar1 == OpTypeStruct) {
      iVar3 = Instruction::getNumOperands(this_00);
      op = 0;
      if (0 < iVar3) {
        do {
          typeId_00 = Instruction::getIdOperand(this_00,op);
          bVar2 = containsPhysicalStorageBufferOrArray(this,typeId_00);
          if (bVar2) {
            return bVar2;
          }
          op = op + 1;
          iVar3 = Instruction::getNumOperands(this_00);
        } while (op < iVar3);
        return bVar2;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Builder::containsPhysicalStorageBufferOrArray(Id typeId) const
{
    const Instruction& instr = *module.getInstruction(typeId);

    Op typeClass = instr.getOpCode();
    switch (typeClass)
    {
    case OpTypePointer:
        return getTypeStorageClass(typeId) == StorageClassPhysicalStorageBufferEXT;
    case OpTypeArray:
        return containsPhysicalStorageBufferOrArray(getContainedTypeId(typeId));
    case OpTypeStruct:
        for (int m = 0; m < instr.getNumOperands(); ++m) {
            if (containsPhysicalStorageBufferOrArray(instr.getIdOperand(m)))
                return true;
        }
        return false;
    default:
        return false;
    }
}